

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

uint32 setup_obs(uint32 ts,uint32 strm,uint32 n_frame,uint32 n_stream,uint32 *veclen,uint32 blksize)

{
  uint32 blksize_local;
  uint32 *veclen_local;
  uint32 n_stream_local;
  uint32 n_frame_local;
  uint32 strm_local;
  uint32 ts_local;
  
  vlen = veclen[strm];
  if (multiclass == 0) {
    strm_local = setup_obs_1class(strm,n_frame,n_stream,veclen,blksize);
  }
  else {
    strm_local = setup_obs_multiclass(ts,strm,n_frame,veclen[strm]);
  }
  return strm_local;
}

Assistant:

uint32
setup_obs(uint32 ts, uint32 strm, uint32 n_frame, uint32 n_stream, uint32 *veclen, uint32 blksize)
{
    vlen = veclen[strm];
    if (multiclass) {
	return setup_obs_multiclass(ts, strm, n_frame, veclen[strm]);
    }
    else {
	return setup_obs_1class(strm, n_frame, n_stream, veclen, blksize);
    }
}